

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImproperCosineInversionType.cpp
# Opt level: O0

void __thiscall
OpenMD::ImproperCosineInversionType::ImproperCosineInversionType
          (ImproperCosineInversionType *this,
          vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
          *parameters)

{
  bool bVar1;
  __normal_iterator<OpenMD::ImproperCosineInversionParameter_*,_std::vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>_>
  this_00;
  pointer pIVar2;
  undefined8 *in_RDI;
  DoublePolynomial sinTerm;
  DoublePolynomial cosTerm;
  DoublePolynomial finalPolynomial;
  ChebyshevU U;
  ChebyshevT T;
  int maxPower;
  iterator i;
  Polynomial<double> *in_stack_fffffffffffffe08;
  PolynomialInversionType *in_stack_fffffffffffffe10;
  PolynomialInversionType *in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  int maxPower_00;
  ChebyshevT *in_stack_fffffffffffffe30;
  __normal_iterator<OpenMD::ImproperCosineInversionParameter_*,_std::vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>_>
  *this_01;
  Polynomial<double> *in_stack_fffffffffffffe60;
  Polynomial<double> *in_stack_fffffffffffffe68;
  Polynomial<double> local_178 [3];
  ImproperCosineInversionParameter *local_e8;
  ImproperCosineInversionParameter *local_e0;
  PolynomialInversionType local_d8 [2];
  int local_54;
  ImproperCosineInversionParameter *local_50;
  ImproperCosineInversionParameter *local_30;
  ImproperCosineInversionParameter *local_28;
  ImproperCosineInversionParameter *local_20;
  __normal_iterator<OpenMD::ImproperCosineInversionParameter_*,_std::vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>_>
  local_18 [3];
  
  maxPower_00 = (int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  PolynomialInversionType::PolynomialInversionType(in_stack_fffffffffffffe20);
  *in_RDI = &PTR__ImproperCosineInversionType_00398c28;
  __gnu_cxx::
  __normal_iterator<OpenMD::ImproperCosineInversionParameter_*,_std::vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>_>
  ::__normal_iterator(local_18);
  local_28 = (ImproperCosineInversionParameter *)
             std::
             vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
             ::begin((vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
                      *)in_stack_fffffffffffffe08);
  local_30 = (ImproperCosineInversionParameter *)
             std::
             vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
             ::end((vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
                    *)in_stack_fffffffffffffe08);
  this_00 = std::
            max_element<__gnu_cxx::__normal_iterator<OpenMD::ImproperCosineInversionParameter*,std::vector<OpenMD::ImproperCosineInversionParameter,std::allocator<OpenMD::ImproperCosineInversionParameter>>>,OpenMD::LessThanPeriodicityFunctor>
                      (local_28,local_30);
  local_20 = this_00._M_current;
  local_18[0] = this_00;
  local_50 = (ImproperCosineInversionParameter *)
             std::
             vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
             ::end((vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
                    *)in_stack_fffffffffffffe08);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<OpenMD::ImproperCosineInversionParameter_*,_std::vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>_>
                      *)in_stack_fffffffffffffe10,
                     (__normal_iterator<OpenMD::ImproperCosineInversionParameter_*,_std::vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>_>
                      *)in_stack_fffffffffffffe08);
  if (bVar1) {
    pIVar2 = __gnu_cxx::
             __normal_iterator<OpenMD::ImproperCosineInversionParameter_*,_std::vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>_>
             ::operator->(local_18);
    local_54 = pIVar2->n;
    ChebyshevT::ChebyshevT(in_stack_fffffffffffffe30,maxPower_00);
    ChebyshevU::ChebyshevU((ChebyshevU *)in_stack_fffffffffffffe30,maxPower_00);
    Polynomial<double>::Polynomial((Polynomial<double> *)0x2fe40b);
    local_e0 = (ImproperCosineInversionParameter *)
               std::
               vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
               ::begin((vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
                        *)in_stack_fffffffffffffe08);
    local_18[0]._M_current = local_e0;
    while( true ) {
      local_e8 = (ImproperCosineInversionParameter *)
                 std::
                 vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
                 ::end((vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
                        *)in_stack_fffffffffffffe08);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<OpenMD::ImproperCosineInversionParameter_*,_std::vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>_>
                          *)in_stack_fffffffffffffe10,
                         (__normal_iterator<OpenMD::ImproperCosineInversionParameter_*,_std::vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>_>
                          *)in_stack_fffffffffffffe08);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<OpenMD::ImproperCosineInversionParameter_*,_std::vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>_>
      ::operator->(local_18);
      ChebyshevT::getChebyshevPolynomial
                ((ChebyshevT *)in_stack_fffffffffffffe10,
                 (int)((ulong)in_stack_fffffffffffffe08 >> 0x20));
      Polynomial<double>::Polynomial
                ((Polynomial<double> *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      this_01 = local_18;
      pIVar2 = __gnu_cxx::
               __normal_iterator<OpenMD::ImproperCosineInversionParameter_*,_std::vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>_>
               ::operator->(this_01);
      cos(pIVar2->delta);
      __gnu_cxx::
      __normal_iterator<OpenMD::ImproperCosineInversionParameter_*,_std::vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>_>
      ::operator->(this_01);
      Polynomial<double>::operator*=((Polynomial<double> *)this_00._M_current,(double)in_RDI);
      __gnu_cxx::
      __normal_iterator<OpenMD::ImproperCosineInversionParameter_*,_std::vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>_>
      ::operator->(local_18);
      ChebyshevU::getChebyshevPolynomial
                ((ChebyshevU *)in_stack_fffffffffffffe10,
                 (int)((ulong)in_stack_fffffffffffffe08 >> 0x20));
      Polynomial<double>::Polynomial
                ((Polynomial<double> *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      pIVar2 = __gnu_cxx::
               __normal_iterator<OpenMD::ImproperCosineInversionParameter_*,_std::vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>_>
               ::operator->(local_18);
      sin(pIVar2->delta);
      __gnu_cxx::
      __normal_iterator<OpenMD::ImproperCosineInversionParameter_*,_std::vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>_>
      ::operator->(local_18);
      Polynomial<double>::operator*=((Polynomial<double> *)this_00._M_current,(double)in_RDI);
      OpenMD::operator+(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      in_stack_fffffffffffffe10 = local_d8;
      in_stack_fffffffffffffe08 = local_178;
      Polynomial<double>::operator=
                ((Polynomial<double> *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      Polynomial<double>::~Polynomial((Polynomial<double> *)0x2fe5b8);
      __gnu_cxx::
      __normal_iterator<OpenMD::ImproperCosineInversionParameter_*,_std::vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>_>
      ::operator->(local_18);
      Polynomial<double>::operator+=
                ((Polynomial<double> *)in_stack_fffffffffffffe10,(double)in_stack_fffffffffffffe08);
      Polynomial<double>::~Polynomial((Polynomial<double> *)0x2fe5e2);
      Polynomial<double>::~Polynomial((Polynomial<double> *)0x2fe5ef);
      __gnu_cxx::
      __normal_iterator<OpenMD::ImproperCosineInversionParameter_*,_std::vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>_>
      ::operator++(local_18);
    }
    Polynomial<double>::Polynomial
              ((Polynomial<double> *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    PolynomialInversionType::setPolynomial(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    Polynomial<double>::~Polynomial((Polynomial<double> *)0x2fe6da);
    Polynomial<double>::~Polynomial((Polynomial<double> *)0x2fe6e7);
    ChebyshevU::~ChebyshevU((ChebyshevU *)0x2fe6f4);
    ChebyshevT::~ChebyshevT((ChebyshevT *)0x2fe701);
  }
  return;
}

Assistant:

ImproperCosineInversionType::ImproperCosineInversionType(
      std::vector<ImproperCosineInversionParameter>& parameters) {
    std::vector<ImproperCosineInversionParameter>::iterator i;
    i = std::max_element(parameters.begin(), parameters.end(),
                         LessThanPeriodicityFunctor());
    if (i != parameters.end()) {
      int maxPower = i->n;
      ChebyshevT T(maxPower);
      ChebyshevU U(maxPower);

      // convert parameters of impropercosine type inversion into
      // PolynomialInversion's parameters
      DoublePolynomial finalPolynomial;
      for (i = parameters.begin(); i != parameters.end(); ++i) {
        DoublePolynomial cosTerm = T.getChebyshevPolynomial(i->n);
        cosTerm *= cos(i->delta) * i->kchi;
        DoublePolynomial sinTerm = U.getChebyshevPolynomial(i->n);
        sinTerm *= -sin(i->delta) * i->kchi;
        finalPolynomial = cosTerm + sinTerm;
        finalPolynomial += i->kchi;
      }
      this->setPolynomial(finalPolynomial);
    }
  }